

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void absl::lts_20250127::FixSkip(PerThreadSynch *ancestor,PerThreadSynch *to_be_removed)

{
  PerThreadSynch *to_be_removed_local;
  PerThreadSynch *ancestor_local;
  
  if (ancestor->skip == to_be_removed) {
    if (to_be_removed->skip == (PerThreadSynch *)0x0) {
      if (ancestor->next == to_be_removed) {
        ancestor->skip = (PerThreadSynch *)0x0;
      }
      else {
        ancestor->skip = ancestor->next;
      }
    }
    else {
      ancestor->skip = to_be_removed->skip;
    }
  }
  return;
}

Assistant:

static void FixSkip(PerThreadSynch* ancestor, PerThreadSynch* to_be_removed) {
  if (ancestor->skip == to_be_removed) {  // ancestor->skip left dangling
    if (to_be_removed->skip != nullptr) {
      ancestor->skip = to_be_removed->skip;  // can skip past to_be_removed
    } else if (ancestor->next != to_be_removed) {  // they are not adjacent
      ancestor->skip = ancestor->next;             // can skip one past ancestor
    } else {
      ancestor->skip = nullptr;  // can't skip at all
    }
  }
}